

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

void __thiscall t_d_generator::generate_typedef(t_d_generator *this,t_typedef *ttypedef)

{
  ostream *poVar1;
  t_type *ttype;
  string *psVar2;
  string local_68;
  string local_38;
  t_typedef *local_18;
  t_typedef *ttypedef_local;
  t_d_generator *this_local;
  
  local_18 = ttypedef;
  ttypedef_local = (t_typedef *)this;
  emit_doc(this,(t_doc *)ttypedef,(ostream *)&this->f_types_);
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"alias ");
  ttype = t_typedef::get_type(local_18);
  render_type_name_abi_cxx11_(&local_68,this,ttype,false);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  poVar1 = std::operator<<(poVar1," ");
  psVar2 = t_typedef::get_symbolic_abi_cxx11_(local_18);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,";");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void generate_typedef(t_typedef* ttypedef) override {
    this->emit_doc(ttypedef, f_types_);
    f_types_ << indent() << "alias " << render_type_name(ttypedef->get_type()) << " "
             << ttypedef->get_symbolic() << ";" << endl << endl;
  }